

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::IO_Action_PDU::ClearStandardVariableRecords(IO_Action_PDU *this)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  
  (this->super_IO_Header).super_Header.super_Header6.m_ui16PDULength = 0x38;
  pKVar1 = (this->m_vStdVarRecs).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vStdVarRecs).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar3 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar3->_vptr_KRef_Ptr)(pKVar3);
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != pKVar2);
    (this->m_vStdVarRecs).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  this->m_ui16NumStdVarRec = 0;
  return;
}

Assistant:

void IO_Action_PDU::ClearStandardVariableRecords()
{
    // Reset the PDU length.
    m_ui16PDULength = IO_ACTION_PDU_SIZE;

    m_vStdVarRecs.clear();
    m_ui16NumStdVarRec = 0;
}